

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_importance.cc
# Opt level: O2

int main(void)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  double local_30;
  vec3 d;
  
  local_30 = 0.0;
  iVar3 = 1000000;
  while (lVar1 = std::cout, bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    random_unit_vector();
    local_30 = local_30 + (d.e[2] * d.e[2]) / 0.07957747154594767;
  }
  *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) = 0xc;
  std::operator<<((ostream *)&std::cout,"I = ");
  poVar2 = std::ostream::_M_insert<double>(local_30 / 1000000.0);
  std::operator<<(poVar2,'\n');
  return 0;
}

Assistant:

int main() {
    int N = 1000000;
    auto sum = 0.0;
    for (int i = 0; i < N; i++) {
        vec3 d = random_unit_vector();
        auto f_d = f(d);
        sum += f_d / pdf(d);
    }
    std::cout << std::fixed << std::setprecision(12);
    std::cout << "I = " << sum / N << '\n';
}